

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O2

void __thiscall
Diligent::GLProgram::SetResources
          (GLProgram *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pResources)

{
  element_type *peVar1;
  string msg;
  string local_38;
  
  if (this->m_LinkStatus != Succeeded) {
    FormatString<char[53]>
              (&local_38,(char (*) [53])"Program must be successfully linked to set resources");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0xa4);
    std::__cxx11::string::~string((string *)&local_38);
  }
  peVar1 = (this->m_pResources).
           super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_pResources).
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>,
               &pResources->
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>);
  }
  else if (peVar1 != (pResources->
                     super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr) {
    FormatString<char[97]>
              (&local_38,
               (char (*) [97])
               "Assigning different resources. This should not happen as cached programs are keyed by shader IDs"
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0xab);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void GLProgram::SetResources(std::shared_ptr<const ShaderResourcesGL> pResources)
{
    DEV_CHECK_ERR(m_LinkStatus == LinkStatus::Succeeded, "Program must be successfully linked to set resources");
    if (!m_pResources)
    {
        m_pResources = std::move(pResources);
    }
    else
    {
        VERIFY(m_pResources == pResources, "Assigning different resources. This should not happen as cached programs are keyed by shader IDs");
    }
}